

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.h
# Opt level: O3

bool comparesEqual(QVersionNumber *lhs,QVersionNumber *rhs)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  bVar1 = (lhs->m_segments).field_0.inline_segments[0];
  if ((bVar1 & 1) == 0) {
    lVar3 = (((lhs->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    lVar3 = (long)((char)bVar1 >> 1);
  }
  bVar1 = (rhs->m_segments).field_0.inline_segments[0];
  if ((bVar1 & 1) == 0) {
    lVar4 = (((rhs->m_segments).field_0.pointer_segments)->d).size;
  }
  else {
    lVar4 = (long)((char)bVar1 >> 1);
  }
  if (lVar3 == lVar4) {
    iVar2 = QVersionNumber::compare(lhs,rhs);
    return iVar2 == 0;
  }
  return false;
}

Assistant:

qsizetype size() const noexcept
        { return isUsingPointer() ? pointer_segments->size() : (inline_segments[InlineSegmentMarker] >> 1); }